

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O2

void putRGBAAseparate8bittile
               (TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
               int32_t fromskew,int32_t toskew,uchar *r,uchar *g,uchar *b,uchar *a)

{
  uchar uVar1;
  uchar uVar2;
  uchar uVar3;
  uchar uVar4;
  long lVar5;
  long lVar6;
  uchar *puVar7;
  uint32_t *puVar8;
  uint32_t uVar9;
  uchar *puVar10;
  uchar *puVar11;
  uchar *puVar12;
  bool bVar13;
  
  lVar5 = (long)fromskew;
  do {
    bVar13 = h == 0;
    h = h - 1;
    if (bVar13) {
      return;
    }
    lVar6 = 0;
    puVar8 = cp;
    for (uVar9 = w; 7 < uVar9; uVar9 = uVar9 - 8) {
      cp[lVar6] = CONCAT13(a[lVar6],CONCAT12(b[lVar6],CONCAT11(g[lVar6],r[lVar6])));
      cp[lVar6 + 1] =
           CONCAT13(a[lVar6 + 1],CONCAT12(b[lVar6 + 1],CONCAT11(g[lVar6 + 1],r[lVar6 + 1])));
      cp[lVar6 + 2] =
           CONCAT13(a[lVar6 + 2],CONCAT12(b[lVar6 + 2],CONCAT11(g[lVar6 + 2],r[lVar6 + 2])));
      cp[lVar6 + 3] =
           CONCAT13(a[lVar6 + 3],CONCAT12(b[lVar6 + 3],CONCAT11(g[lVar6 + 3],r[lVar6 + 3])));
      cp[lVar6 + 4] =
           CONCAT13(a[lVar6 + 4],CONCAT12(b[lVar6 + 4],CONCAT11(g[lVar6 + 4],r[lVar6 + 4])));
      cp[lVar6 + 5] =
           CONCAT13(a[lVar6 + 5],CONCAT12(b[lVar6 + 5],CONCAT11(g[lVar6 + 5],r[lVar6 + 5])));
      cp[lVar6 + 6] =
           CONCAT13(a[lVar6 + 6],CONCAT12(b[lVar6 + 6],CONCAT11(g[lVar6 + 6],r[lVar6 + 6])));
      puVar8 = puVar8 + 8;
      cp[lVar6 + 7] =
           CONCAT13(a[lVar6 + 7],CONCAT12(b[lVar6 + 7],CONCAT11(g[lVar6 + 7],r[lVar6 + 7])));
      lVar6 = lVar6 + 8;
    }
    puVar10 = r + lVar6;
    puVar11 = g + lVar6;
    puVar7 = b + lVar6;
    puVar12 = a + lVar6;
    switch(uVar9) {
    case 7:
      puVar10 = r + lVar6 + 1;
      puVar11 = g + lVar6 + 1;
      puVar7 = b + lVar6 + 1;
      puVar12 = a + lVar6 + 1;
      *puVar8 = CONCAT13(a[lVar6],CONCAT12(b[lVar6],CONCAT11(g[lVar6],r[lVar6])));
      puVar8 = puVar8 + 1;
    case 6:
      uVar1 = *puVar10;
      puVar10 = puVar10 + 1;
      uVar2 = *puVar11;
      puVar11 = puVar11 + 1;
      uVar3 = *puVar7;
      puVar7 = puVar7 + 1;
      uVar4 = *puVar12;
      puVar12 = puVar12 + 1;
      *puVar8 = CONCAT13(uVar4,CONCAT12(uVar3,CONCAT11(uVar2,uVar1)));
      puVar8 = puVar8 + 1;
    case 5:
      uVar1 = *puVar10;
      puVar10 = puVar10 + 1;
      uVar2 = *puVar11;
      puVar11 = puVar11 + 1;
      uVar3 = *puVar7;
      puVar7 = puVar7 + 1;
      uVar4 = *puVar12;
      puVar12 = puVar12 + 1;
      *puVar8 = CONCAT13(uVar4,CONCAT12(uVar3,CONCAT11(uVar2,uVar1)));
      puVar8 = puVar8 + 1;
    case 4:
      uVar1 = *puVar10;
      puVar10 = puVar10 + 1;
      uVar2 = *puVar11;
      puVar11 = puVar11 + 1;
      uVar3 = *puVar7;
      puVar7 = puVar7 + 1;
      uVar4 = *puVar12;
      puVar12 = puVar12 + 1;
      *puVar8 = CONCAT13(uVar4,CONCAT12(uVar3,CONCAT11(uVar2,uVar1)));
      puVar8 = puVar8 + 1;
    case 3:
      uVar1 = *puVar10;
      puVar10 = puVar10 + 1;
      uVar2 = *puVar11;
      puVar11 = puVar11 + 1;
      uVar3 = *puVar7;
      puVar7 = puVar7 + 1;
      uVar4 = *puVar12;
      puVar12 = puVar12 + 1;
      *puVar8 = CONCAT13(uVar4,CONCAT12(uVar3,CONCAT11(uVar2,uVar1)));
      puVar8 = puVar8 + 1;
    case 2:
      uVar1 = *puVar10;
      puVar10 = puVar10 + 1;
      uVar2 = *puVar11;
      puVar11 = puVar11 + 1;
      uVar3 = *puVar7;
      puVar7 = puVar7 + 1;
      uVar4 = *puVar12;
      puVar12 = puVar12 + 1;
      *puVar8 = CONCAT13(uVar4,CONCAT12(uVar3,CONCAT11(uVar2,uVar1)));
      puVar8 = puVar8 + 1;
    case 1:
      uVar1 = *puVar10;
      puVar10 = puVar10 + 1;
      uVar2 = *puVar11;
      puVar11 = puVar11 + 1;
      uVar3 = *puVar7;
      puVar7 = puVar7 + 1;
      uVar4 = *puVar12;
      puVar12 = puVar12 + 1;
      *puVar8 = CONCAT13(uVar4,CONCAT12(uVar3,CONCAT11(uVar2,uVar1)));
      puVar8 = puVar8 + 1;
    case 0:
      r = puVar10 + lVar5;
      g = puVar11 + lVar5;
      b = puVar7 + lVar5;
      a = puVar12 + lVar5;
      cp = puVar8 + toskew;
    }
  } while( true );
}

Assistant:

DECLARESepPutFunc(putRGBAAseparate8bittile)
{
    (void)img;
    (void)x;
    (void)y;
    for (; h > 0; --h)
    {
        UNROLL8(w, NOP, *cp++ = PACK4(*r++, *g++, *b++, *a++));
        SKEW4(r, g, b, a, fromskew);
        cp += toskew;
    }
}